

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp_sample.c
# Opt level: O3

int main(void)

{
  int iVar1;
  HTTP_CLIENT_RESULT HVar2;
  IO_INTERFACE_DESCRIPTION *io_interface_desc;
  HTTP_CLIENT_HANDLE handle;
  int local_2c;
  char *local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    puts("\r\nSending HTTP GET\r\n\r");
    local_2c = 0;
    local_18 = 0;
    local_28 = "httpbin.org";
    local_20 = 0x50;
    io_interface_desc = socketio_get_interface_description();
    handle = uhttp_client_create(io_interface_desc,&local_28,on_error,&local_2c);
    if (handle == (HTTP_CLIENT_HANDLE)0x0) {
      puts("FAILED HERE\r");
    }
    else {
      uhttp_client_set_trace(handle,true,true);
      HVar2 = uhttp_client_open(handle,"httpbin.org",0x50,on_http_connected,&local_2c);
      if (HVar2 == HTTP_CLIENT_OK) {
        HVar2 = uhttp_client_execute_request
                          (handle,HTTP_CLIENT_REQUEST_GET,"/get",(HTTP_HEADERS_HANDLE)0x0,
                           (uchar *)0x0,0,on_http_recv,&local_2c);
        if (HVar2 == HTTP_CLIENT_OK) {
          do {
            uhttp_client_dowork(handle);
          } while (local_2c == 0);
        }
        else {
          puts("FAILED FURTHER HERE\r");
        }
        uhttp_client_close(handle,on_closed_callback,(void *)0x0);
      }
      else {
        puts("FAILED MORE HERE\r");
      }
      uhttp_client_destroy(handle);
    }
    puts("\r\nSending HTTP POST\r\n\r");
    test_http_post();
    platform_deinit();
    iVar1 = 0;
  }
  else {
    puts("platform_init\r");
    iVar1 = 0xc1;
  }
  printf("Press any key to continue:");
  getchar();
  return iVar1;
}

Assistant:

int main(void)
{
    int result;

    if (platform_init() != 0)
    {
        (void)printf("platform_init\r\n");
        result = __LINE__;
    }
    else
    {
        result = 0;

        (void)printf("\r\nSending HTTP GET\r\n\r\n");
        test_http_get();

        (void)printf("\r\nSending HTTP POST\r\n\r\n");
        test_http_post();

        platform_deinit();
    }

    (void)printf("Press any key to continue:");
    (void)getchar();
    return result;
}